

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPU4StateImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  int *in_RCX;
  double *in_RDX;
  BeagleCPU4StateImpl<double,_1,_0> *in_RSI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double *unaff_retaddr;
  int in_stack_00000008;
  int k_1;
  double wtl;
  int u;
  int l;
  int k;
  double wt0;
  int v;
  double *wt;
  double *rootPartials;
  int endPattern;
  int startPattern;
  int pIndex;
  int p;
  int local_7c;
  int local_6c;
  int local_68;
  int local_64;
  int local_54;
  int partitionCount_00;
  
  for (partitionCount_00 = 0; partitionCount_00 < in_stack_00000008;
      partitionCount_00 = partitionCount_00 + 1) {
    iVar2 = *(int *)(*(long *)(in_RDI + 0x90) + (long)in_R9[partitionCount_00] * 4);
    iVar3 = *(int *)(*(long *)(in_RDI + 0x90) + (long)(in_R9[partitionCount_00] + 1) * 4);
    lVar4 = *(long *)(*(long *)(in_RDI + 0xb0) +
                     (long)*(int *)((long)&(in_RSI->super_BeagleCPUImpl<double,_1,_0>).
                                           super_BeagleImpl._vptr_BeagleImpl +
                                   (long)partitionCount_00 * 4) * 8);
    pdVar5 = *(double **)
              (*(long *)(in_RDI + 0xa0) +
              (long)*(int *)((long)in_RDX + (long)partitionCount_00 * 4) * 8);
    local_54 = iVar2 << 2;
    dVar1 = *pdVar5;
    for (local_64 = iVar2; local_64 < iVar3; local_64 = local_64 + 1) {
      *(double *)(*(long *)(in_RDI + 0xe0) + (long)local_54 * 8) =
           *(double *)(lVar4 + (long)local_54 * 8) * dVar1;
      *(double *)(*(long *)(in_RDI + 0xe0) + (long)(local_54 + 1) * 8) =
           *(double *)(lVar4 + (long)(local_54 + 1) * 8) * dVar1;
      *(double *)(*(long *)(in_RDI + 0xe0) + (long)(local_54 + 2) * 8) =
           *(double *)(lVar4 + (long)(local_54 + 2) * 8) * dVar1;
      *(double *)(*(long *)(in_RDI + 0xe0) + (long)(local_54 + 3) * 8) =
           *(double *)(lVar4 + (long)(local_54 + 3) * 8) * dVar1;
      local_54 = local_54 + 4;
    }
    for (local_68 = 1; local_68 < *(int *)(in_RDI + 0x34); local_68 = local_68 + 1) {
      local_6c = iVar2 << 2;
      local_54 = ((*(int *)(in_RDI + 0x14) - iVar3) + iVar2) * 4 + local_54;
      dVar1 = pdVar5[local_68];
      for (local_7c = iVar2; local_7c < iVar3; local_7c = local_7c + 1) {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *(ulong *)(lVar4 + (long)local_54 * 8);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = dVar1;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_6c * 8);
        auVar6 = vfmadd213sd_fma(auVar6,auVar10,auVar14);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_6c * 8) = auVar6._0_8_;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)(lVar4 + (long)(local_54 + 1) * 8);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = dVar1;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_6c + 1) * 8);
        auVar6 = vfmadd213sd_fma(auVar7,auVar11,auVar15);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_6c + 1) * 8) = auVar6._0_8_;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *(ulong *)(lVar4 + (long)(local_54 + 2) * 8);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = dVar1;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_6c + 2) * 8);
        auVar6 = vfmadd213sd_fma(auVar8,auVar12,auVar16);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_6c + 2) * 8) = auVar6._0_8_;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *(ulong *)(lVar4 + (long)(local_54 + 3) * 8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dVar1;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_6c + 3) * 8);
        auVar6 = vfmadd213sd_fma(auVar9,auVar13,auVar17);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_6c + 3) * 8) = auVar6._0_8_;
        local_6c = local_6c + 4;
        local_54 = local_54 + 4;
      }
      local_54 = *(int *)(in_RDI + 0x1c) * 4 + local_54;
    }
  }
  integrateOutStatesAndScaleByPartition
            (in_RSI,in_RDX,in_RCX,in_R8,in_R9,partitionCount_00,unaff_retaddr);
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                                    const int* bufferIndices,
                                                                    const int* categoryWeightsIndices,
                                                                    const int* stateFrequenciesIndices,
                                                                    const int* cumulativeScaleIndices,
                                                                    const int* partitionIndices,
                                                                    int partitionCount,
                                                                    double* outSumLogLikelihoodByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        assert(rootPartials);
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];

        int v = startPattern * 4;
        const REALTYPE wt0 = wt[0];
        for (int k = startPattern; k < endPattern; k++) {
            integrationTmp[v    ] = rootPartials[v    ] * wt0;
            integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
            integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
            integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
            v += 4;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            int u = startPattern * 4;
            v += ((kPatternCount - endPattern) + startPattern) * 4;
            const REALTYPE wtl = wt[l];
            for (int k = startPattern; k < endPattern; k++) {
                integrationTmp[u    ] += rootPartials[v    ] * wtl;
                integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
                integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
                integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

                u += 4;
                v += 4;
            }
        v += 4 * kExtraPatterns;
        }
    }
    integrateOutStatesAndScaleByPartition(integrationTmp, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
}